

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O3

shared_ptr<SchemeVector> __thiscall
SchemeVector::from_list(SchemeVector *this,shared_ptr<SchemePair> *list)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr p_Var3;
  pointer psVar4;
  element_type *peVar5;
  runtime_error *this_01;
  SchemePair *__tmp;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Base_ptr p_Var8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *peVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  shared_ptr<SchemeVector> sVar12;
  initializer_list<const_SchemePair_*> __l;
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  allocator_type local_6a;
  less<const_SchemePair_*> local_69;
  element_type *local_68;
  _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  local_60;
  
  psVar4 = (pointer)operator_new(0x30);
  (psVar4->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  (psVar4->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0016bdb8;
  psVar4[1].super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__SchemeVector_0016ba50;
  psVar4[1].super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar4[2].super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  psVar4[2].super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->vec).
  super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar4;
  (this->super_SchemeObject)._vptr_SchemeObject = (_func_int **)(psVar4 + 1);
  local_68 = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = &local_68;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_> *
      )&local_60,__l,&local_69,&local_6a);
  peVar9 = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar9 != (element_type *)0x0) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    do {
      if (peVar9 == (element_type *)
                    scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      {
        std::
        _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
        ::~_Rb_tree(&local_60);
        sVar12.super___shared_ptr<SchemeVector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        sVar12.super___shared_ptr<SchemeVector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
        return (shared_ptr<SchemeVector>)
               sVar12.super___shared_ptr<SchemeVector,_(__gnu_cxx::_Lock_policy)2>;
      }
      std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
      push_back((vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                 *)((this->super_SchemeObject)._vptr_SchemeObject + 1),&peVar9->car);
      peVar9 = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar2 = (peVar9->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar6 = (element_type *)0x0;
      }
      else {
        peVar5 = (element_type *)
                 __dynamic_cast(peVar2,&SchemeObject::typeinfo,&SchemePair::typeinfo,0);
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar6 = (element_type *)0x0;
        if (peVar5 != (element_type *)0x0) {
          p_Var7 = (peVar9->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          peVar6 = peVar5;
          if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
      }
      (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar6;
      this_00 = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
      ;
      (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var7;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        peVar6 = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var10 = p_Var11;
          p_Var8 = p_Var3;
          peVar9 = *(element_type **)(p_Var8 + 1);
          p_Var11 = p_Var8;
          if (peVar9 < peVar6) {
            p_Var11 = p_Var10;
          }
          p_Var3 = (&p_Var8->_M_left)[peVar9 < peVar6];
        } while ((&p_Var8->_M_left)[peVar9 < peVar6] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var11 != p_Var1) {
          if (peVar9 < peVar6) {
            p_Var8 = p_Var10;
          }
          if (*(element_type **)(p_Var8 + 1) <= peVar6) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,"Vector initialization failed: not a list");
            goto LAB_001271d6;
          }
        }
      }
      local_68 = peVar6;
      std::
      _Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
      ::_M_insert_unique<SchemePair_const*>
                ((_Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
                  *)&local_60,&local_68);
      peVar9 = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    } while (peVar9 != (element_type *)0x0);
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Vector initialization failed: not a list");
LAB_001271d6:
  *(undefined ***)this_01 = &PTR__runtime_error_0016b300;
  __cxa_throw(this_01,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<SchemeVector> SchemeVector::from_list(std::shared_ptr<SchemePair> list)
{
    auto v = std::make_shared<SchemeVector>();
    std::set<const SchemePair *> visited{list.get()};
    while(list && list != scheme_nil)
    {
        v->vec.push_back(list->car);
        list = std::dynamic_pointer_cast<SchemePair>(list->cdr);
        if(visited.count(list.get()))
            throw eval_error("Vector initialization failed: not a list");
        visited.insert(list.get());
    }
    if(!list)
        throw eval_error("Vector initialization failed: not a list");
    return v;
}